

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

int __thiscall
FOptionMenuItemColorPicker::Draw
          (FOptionMenuItemColorPicker *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  DFrameBuffer *pDVar1;
  uint32 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  EColorRange local_44;
  int box_y;
  int box_x;
  bool selected_local;
  int indent_local;
  int y_local;
  FOptionMenuDescriptor *desc_local;
  FOptionMenuItemColorPicker *this_local;
  
  if (selected) {
    local_44 = OptionSettings.mFontColorSelection;
  }
  else {
    local_44 = OptionSettings.mFontColor;
  }
  FOptionMenuItem::drawLabel(&this->super_FOptionMenuItem,indent,y,local_44,false);
  pDVar1 = screen;
  if (this->mCVar != (FColorCVar *)0x0) {
    uVar3 = indent + CleanXfac_1 * 0xe;
    uVar4 = y + CleanYfac_1;
    iVar5 = CleanXfac_1 * 0x20;
    iVar6 = OptionSettings.mLinespacing * CleanYfac_1;
    uVar2 = FColorCVar::operator_cast_to_unsigned_int(this->mCVar);
    (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (pDVar1,(ulong)uVar3,(ulong)uVar4,(ulong)(uVar3 + iVar5),(ulong)(uVar4 + iVar6),
               0xffffffff,uVar2 | 0xff000000);
  }
  return indent;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		drawLabel(indent, y, selected? OptionSettings.mFontColorSelection : OptionSettings.mFontColor);

		if (mCVar != NULL)
		{
			int box_x = indent + CURSORSPACE;
			int box_y = y + CleanYfac_1;
			screen->Clear (box_x, box_y, box_x + 32*CleanXfac_1, box_y + OptionSettings.mLinespacing*CleanYfac_1,
				-1, (uint32)*mCVar | 0xff000000);
		}
		return indent;
	}